

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O2

void rr::readVertexAttrib(IVec4 *dst,VertexAttrib *vertexAttrib,int instanceNdx,int vertexNdx)

{
  VertexAttribType VVar1;
  uint uVar2;
  undefined8 uVar3;
  int iVar4;
  void *__src;
  size_t __n;
  char aligned [4];
  undefined4 local_38;
  undefined4 local_34;
  int local_30;
  int local_2c;
  
  if (vertexAttrib->pointer == (void *)0x0) {
    uVar3 = *(undefined8 *)((long)&(vertexAttrib->generic).v + 8);
    *(undefined8 *)dst->m_data = *(undefined8 *)&(vertexAttrib->generic).v;
    *(undefined8 *)(dst->m_data + 2) = uVar3;
    return;
  }
  if (vertexAttrib->instanceDivisor != 0) {
    vertexNdx = instanceNdx / vertexAttrib->instanceDivisor;
  }
  iVar4 = anon_unknown_1::getComponentSize(vertexAttrib->type);
  iVar4 = iVar4 * vertexAttrib->size;
  if (vertexAttrib->stride != 0) {
    iVar4 = vertexAttrib->stride;
  }
  dst->m_data[0] = 0;
  dst->m_data[1] = 0;
  dst->m_data[2] = 0;
  dst->m_data[3] = 1;
  VVar1 = vertexAttrib->type;
  uVar2 = vertexAttrib->size;
  __n = (size_t)(int)uVar2;
  __src = (void *)((long)(iVar4 * vertexNdx) + (long)vertexAttrib->pointer);
  if (VVar1 == VERTEXATTRIBTYPE_PURE_INT32) {
    memcpy(&local_38,__src,__n << 2);
    dst->m_data[0] = local_38;
    if ((int)uVar2 < 2) {
      return;
    }
    dst->m_data[1] = local_34;
    if (uVar2 == 2) {
      return;
    }
    dst->m_data[2] = local_30;
    if (uVar2 < 4) {
      return;
    }
  }
  else if (VVar1 == VERTEXATTRIBTYPE_PURE_INT16) {
    memcpy(&local_38,__src,__n * 2);
    dst->m_data[0] = (int)(short)local_38;
    if ((int)uVar2 < 2) {
      return;
    }
    dst->m_data[1] = (int)local_38._2_2_;
    if (uVar2 == 2) {
      return;
    }
    dst->m_data[2] = (int)(short)local_34;
    if (uVar2 < 4) {
      return;
    }
    local_2c = (int)local_34._2_2_;
  }
  else {
    if (VVar1 != VERTEXATTRIBTYPE_PURE_INT8) {
      return;
    }
    memcpy(&local_38,__src,__n);
    dst->m_data[0] = (int)(char)local_38;
    if ((int)uVar2 < 2) {
      return;
    }
    dst->m_data[1] = (int)local_38._1_1_;
    if (uVar2 == 2) {
      return;
    }
    dst->m_data[2] = (int)local_38._2_1_;
    if (uVar2 < 4) {
      return;
    }
    local_2c = (int)local_38._3_1_;
  }
  dst->m_data[3] = local_2c;
  return;
}

Assistant:

void readVertexAttrib (tcu::IVec4& dst, const VertexAttrib& vertexAttrib, const int instanceNdx, const int vertexNdx)
{
	DE_ASSERT(isValidVertexAttrib(vertexAttrib));

	if (vertexAttrib.pointer)
	{
		const int	elementNdx		= (vertexAttrib.instanceDivisor != 0) ? (instanceNdx / vertexAttrib.instanceDivisor) : vertexNdx;
		const int	compSize		= getComponentSize(vertexAttrib.type);
		const int	stride			= (vertexAttrib.stride != 0) ? (vertexAttrib.stride) : (vertexAttrib.size*compSize);
		const int	byteOffset		= elementNdx*stride;

		dst = tcu::IVec4(0, 0, 0, 1); // defaults
		readInt(dst, vertexAttrib.type, vertexAttrib.size, (const deUint8*)vertexAttrib.pointer + byteOffset);
	}
	else
	{
		dst = vertexAttrib.generic.get<deInt32>();
	}
}